

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

void greatest_prng_step(int id)

{
  unsigned_long uVar1;
  
  uVar1 = greatest_info.prng[id].state;
  do {
    uVar1 = uVar1 * greatest_info.prng[id].a + greatest_info.prng[id].c &
            greatest_info.prng[id].m - 1;
  } while (greatest_info.prng[id].count_ceil <= uVar1);
  greatest_info.prng[id].state = uVar1;
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}